

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

void __thiscall miniros::Subscription::~Subscription(Subscription *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_002abbe0;
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::clear(&(this->pending_connections_)._M_t);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::clear(&this->callbacks_);
  std::
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ::~vector(&this->cached_deserializers_);
  std::
  _Rb_tree<std::shared_ptr<miniros::PublisherLink>,_std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>,_std::_Select1st<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
  ::~_Rb_tree(&(this->latched_messages_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::StatisticsLogger::StatData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::StatisticsLogger::StatData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::StatisticsLogger::StatData>_>_>
  ::~_Rb_tree(&(this->statistics_).map_._M_t);
  Publisher::~Publisher(&(this->statistics_).pub_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->transport_hints_).options_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->transport_hints_).transports_);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::~vector(&this->publisher_links_);
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::~_Rb_tree(&(this->pending_connections_)._M_t);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::~vector(&this->callbacks_);
  pcVar3 = (this->datatype_)._M_dataplus._M_p;
  paVar2 = &(this->datatype_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->md5sum_)._M_dataplus._M_p;
  paVar2 = &(this->md5sum_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar2 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
           super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Subscription::~Subscription()
{
  pending_connections_.clear();
  callbacks_.clear();
}